

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcCom.c
# Opt level: O2

int Abc_CommandShortNames(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Wlc_Ntk_t *p;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  
  p = (Wlc_Ntk_t *)pAbc->pAbcWlc;
  bVar1 = false;
  Extra_UtilGetoptReset();
  while( true ) {
    iVar2 = Extra_UtilGetopt(argc,argv,"vh");
    if (iVar2 != 0x76) break;
    bVar1 = (bool)(bVar1 ^ 1);
  }
  if (iVar2 == -1) {
    if (p == (Wlc_Ntk_t *)0x0) {
      iVar2 = 0;
      Abc_Print(1,"Abc_CommandProfile(): There is no current design.\n");
    }
    else {
      Wlc_NtkShortNames(p);
      iVar2 = 0;
    }
  }
  else {
    Abc_Print(-2,"usage: %%short_names [-vh]\n");
    Abc_Print(-2,"\t         derives short names for all objects of the network\n");
    pcVar3 = "yes";
    if (!bVar1) {
      pcVar3 = "no";
    }
    Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar3);
    Abc_Print(-2,"\t-h     : print the command usage\n");
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int Abc_CommandShortNames( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Wlc_Ntk_t * pNtk = Wlc_AbcGetNtk(pAbc);
    int c, fVerbose  = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( 1, "Abc_CommandProfile(): There is no current design.\n" );
        return 0;
    }
    Wlc_NtkShortNames( pNtk );
    return 0;
usage:
    Abc_Print( -2, "usage: %%short_names [-vh]\n" );
    Abc_Print( -2, "\t         derives short names for all objects of the network\n" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}